

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::AddTxOut
          (ConfidentialTxOutReference *__return_storage_ptr__,
          ConfidentialTransactionController *this,ElementsConfidentialAddress *address,Amount *value
          ,ConfidentialAssetId *asset,bool remove_nonce)

{
  ByteData nonce;
  ByteData hash_data;
  Script locking_script;
  ElementsConfidentialAddress confidential_addr;
  string sStack_288;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_268;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_250;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  Script local_220;
  ElementsConfidentialAddress local_1e8;
  
  core::ElementsConfidentialAddress::GetHash((ByteData *)&local_238,address);
  core::ElementsConfidentialAddress::GetLockingScript(&local_220,address);
  core::ByteData::ByteData((ByteData *)&local_268);
  if (!remove_nonce) {
    core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&sStack_288,address);
    core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_1e8,&sStack_288);
    std::__cxx11::string::~string((string *)&sStack_288);
    core::ElementsConfidentialAddress::GetConfidentialKey((ConfidentialKey *)&local_250,&local_1e8);
    core::Pubkey::GetData((ByteData *)&sStack_288,(Pubkey *)&local_250);
    core::ByteData::operator=((ByteData *)&local_268,(ByteData *)&sStack_288);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sStack_288);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_250);
    core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_1e8);
  }
  core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_1e8,(ByteData *)&local_268)
  ;
  AddTxOut(__return_storage_ptr__,this,&local_220,value,asset,(ConfidentialNonce *)&local_1e8);
  core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&local_1e8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_268);
  core::Script::~Script(&local_220);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_238);
  return __return_storage_ptr__;
}

Assistant:

const ConfidentialTxOutReference ConfidentialTransactionController::AddTxOut(
    const ElementsConfidentialAddress& address, const Amount& value,
    const ConfidentialAssetId& asset, bool remove_nonce) {
  const ByteData hash_data = address.GetHash();
  Script locking_script = address.GetLockingScript();

  ByteData nonce;
  if (!remove_nonce) {
    ElementsConfidentialAddress confidential_addr(address.GetAddress());
    nonce = confidential_addr.GetConfidentialKey().GetData();
  }
  return AddTxOut(locking_script, value, asset, ConfidentialNonce(nonce));
}